

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall kj::Arena::setDestructor(Arena *this,void *ptr,_func_void_void_ptr *destructor)

{
  Fault local_30;
  Fault f;
  ObjectHeader *header;
  _func_void_void_ptr *destructor_local;
  void *ptr_local;
  Arena *this_local;
  
  f.exception = (Exception *)((long)ptr - 0x10);
  if (((ulong)f.exception & 7) == 0) {
    ((f.exception)->ownFile).content.ptr = (char *)destructor;
    *(ObjectHeader **)((long)ptr + -8) = this->objectList;
    this->objectList = (ObjectHeader *)f.exception;
    return;
  }
  _::Debug::Fault::Fault
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena.c++"
             ,0xa1,FAILED,"reinterpret_cast<uintptr_t>(header) % alignof(ObjectHeader) == 0","");
  _::Debug::Fault::fatal(&local_30);
}

Assistant:

void Arena::setDestructor(void* ptr, void (*destructor)(void*)) {
  ObjectHeader* header = reinterpret_cast<ObjectHeader*>(ptr) - 1;
  KJ_DASSERT(reinterpret_cast<uintptr_t>(header) % alignof(ObjectHeader) == 0);
  header->destructor = destructor;
  header->next = objectList;
  objectList = header;
}